

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O3

void __thiscall Assimp::Vertex::Vertex(Vertex *this,aiAnimMesh *msh,uint idx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  long lVar4;
  undefined8 uVar5;
  float fVar6;
  ulong uVar7;
  aiVector3D *paVar8;
  long lVar9;
  
  memset(this,0,0x110);
  if (msh->mNumVertices <= idx) {
    __assert_fail("idx < msh->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/Vertex.h"
                  ,0x89,"Assimp::Vertex::Vertex(const aiAnimMesh *, unsigned int)");
  }
  paVar8 = msh->mVertices;
  uVar7 = (ulong)idx;
  (this->position).z = paVar8[uVar7].z;
  paVar8 = paVar8 + uVar7;
  fVar6 = paVar8->y;
  (this->position).x = paVar8->x;
  (this->position).y = fVar6;
  paVar8 = msh->mNormals;
  if (paVar8 != (aiVector3D *)0x0) {
    (this->normal).z = paVar8[uVar7].z;
    fVar6 = paVar8[uVar7].y;
    (this->normal).x = paVar8[uVar7].x;
    (this->normal).y = fVar6;
  }
  paVar8 = msh->mTangents;
  if (paVar8 != (aiVector3D *)0x0) {
    (this->tangent).z = paVar8[uVar7].z;
    fVar6 = paVar8[uVar7].y;
    (this->tangent).x = paVar8[uVar7].x;
    (this->tangent).y = fVar6;
    paVar8 = msh->mBitangents;
    (this->bitangent).z = paVar8[uVar7].z;
    paVar8 = paVar8 + uVar7;
    fVar6 = paVar8->y;
    (this->bitangent).x = paVar8->x;
    (this->bitangent).y = fVar6;
  }
  paVar8 = this->texcoords;
  lVar9 = 0;
  do {
    paVar3 = msh->mTextureCoords[lVar9];
    if (paVar3 == (aiVector3D *)0x0) break;
    paVar8->z = paVar3[uVar7].z;
    fVar6 = paVar3[uVar7].y;
    paVar8->x = paVar3[uVar7].x;
    paVar8->y = fVar6;
    lVar9 = lVar9 + 1;
    paVar8 = paVar8 + 1;
  } while (lVar9 != 8);
  lVar9 = 0;
  do {
    lVar4 = *(long *)((long)msh->mColors + lVar9);
    if (lVar4 == 0) {
      return;
    }
    puVar1 = (undefined8 *)(lVar4 + uVar7 * 0x10);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)&this->colors[0].r + lVar9 * 2);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x40);
  return;
}

Assistant:

explicit Vertex(const aiAnimMesh* msh, unsigned int idx) {
        ai_assert(idx < msh->mNumVertices);
        position = msh->mVertices[idx];

        if (msh->HasNormals()) {
            normal = msh->mNormals[idx];
        }

        if (msh->HasTangentsAndBitangents()) {
            tangent = msh->mTangents[idx];
            bitangent = msh->mBitangents[idx];
        }

        for (unsigned int i = 0; msh->HasTextureCoords(i); ++i) {
            texcoords[i] = msh->mTextureCoords[i][idx];
        }

        for (unsigned int i = 0; msh->HasVertexColors(i); ++i) {
           colors[i] = msh->mColors[i][idx];
        }
    }